

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O1

void __thiscall
OpenMD::LangevinPiston::getPosScale
          (LangevinPiston *this,Vector3d *pos,Vector3d *COM,int index,Vector3d *sc)

{
  double dVar1;
  pointer pVVar2;
  uint i_1;
  long lVar3;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result;
  Vector<double,_3U> result_2;
  
  pVVar2 = (this->super_NPT).oldPos.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  result.data_[0] = 0.0;
  result.data_[1] = 0.0;
  result.data_[2] = 0.0;
  lVar3 = 0;
  do {
    result.data_[lVar3] =
         pVVar2[index].super_Vector<double,_3U>.data_[lVar3] +
         (pos->super_Vector<double,_3U>).data_[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  result_1.data_[0] = 0.0;
  result_1.data_[1] = 0.0;
  result_1.data_[2] = 0.0;
  lVar3 = 0;
  do {
    result_1.data_[lVar3] = result.data_[lVar3] * 0.5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  result_2.data_[0] = 0.0;
  result_2.data_[1] = 0.0;
  result_2.data_[2] = 0.0;
  lVar3 = 0;
  do {
    result_2.data_[lVar3] = result_1.data_[lVar3] - (COM->super_Vector<double,_3U>).data_[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  dVar1 = this->eta;
  result_1.data_[0] = 0.0;
  result_1.data_[1] = 0.0;
  result_1.data_[2] = 0.0;
  lVar3 = 0;
  do {
    result_1.data_[lVar3] = result_2.data_[lVar3] * dVar1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  (sc->super_Vector<double,_3U>).data_[2] = result_1.data_[2];
  (sc->super_Vector<double,_3U>).data_[0] = result_1.data_[0];
  (sc->super_Vector<double,_3U>).data_[1] = result_1.data_[1];
  return;
}

Assistant:

void LangevinPiston::getPosScale(const Vector3d& pos, const Vector3d& COM,
                                   int index, Vector3d& sc) {
    Vector3d rj = (oldPos[index] + pos) / (RealType)2.0 - COM;
    sc          = eta * rj;
  }